

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::replace_illegal_names(CompilerHLSL *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  string *local_1848;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_105c;
  key_equal local_105b;
  hasher local_105a;
  undefined1 local_1059;
  allocator local_1058;
  allocator local_1057;
  allocator local_1056;
  allocator local_1055;
  allocator local_1054;
  allocator local_1053;
  allocator local_1052;
  allocator local_1051;
  allocator local_1050;
  allocator local_104f;
  allocator local_104e;
  allocator local_104d;
  allocator local_104c;
  allocator local_104b;
  allocator local_104a;
  allocator local_1049;
  allocator local_1048;
  allocator local_1047;
  allocator local_1046;
  allocator local_1045;
  allocator local_1044;
  allocator local_1043;
  allocator local_1042;
  allocator local_1041;
  allocator local_1040;
  allocator local_103f;
  allocator local_103e;
  allocator local_103d;
  allocator local_103c;
  allocator local_103b;
  allocator local_103a;
  allocator local_1039;
  allocator local_1038;
  allocator local_1037;
  allocator local_1036;
  allocator local_1035;
  allocator local_1034;
  allocator local_1033;
  allocator local_1032;
  allocator local_1031;
  allocator local_1030;
  allocator local_102f;
  allocator local_102e;
  allocator local_102d;
  allocator local_102c;
  allocator local_102b;
  allocator local_102a;
  allocator local_1029;
  allocator local_1028;
  allocator local_1027;
  allocator local_1026;
  allocator local_1025;
  allocator local_1024;
  allocator local_1023;
  allocator local_1022;
  allocator local_1021;
  allocator local_1020;
  allocator local_101f;
  allocator local_101e;
  allocator local_101d;
  allocator local_101c;
  allocator local_101b;
  allocator local_101a;
  allocator local_1019;
  allocator local_1018;
  allocator local_1017;
  allocator local_1016;
  allocator local_1015;
  allocator local_1014;
  allocator local_1013;
  allocator local_1012;
  allocator local_1011;
  allocator local_1010;
  allocator local_100f;
  allocator local_100e;
  allocator local_100d;
  allocator local_100c;
  allocator local_100b;
  allocator local_100a;
  allocator local_1009;
  allocator local_1008;
  allocator local_1007;
  allocator local_1006;
  allocator local_1005;
  allocator local_1004;
  allocator local_1003;
  allocator local_1002;
  allocator local_1001;
  allocator local_1000;
  allocator local_fff;
  allocator local_ffe;
  allocator local_ffd;
  allocator local_ffc;
  allocator local_ffb;
  allocator local_ffa;
  allocator local_ff9;
  allocator local_ff8;
  allocator local_ff7;
  allocator local_ff6;
  allocator local_ff5;
  allocator local_ff4;
  allocator local_ff3;
  allocator local_ff2;
  allocator local_ff1;
  allocator local_ff0;
  allocator local_fef;
  allocator local_fee;
  allocator local_fed;
  allocator local_fec;
  allocator local_feb;
  allocator local_fea;
  allocator local_fe9;
  allocator local_fe8;
  allocator local_fe7;
  allocator local_fe6;
  allocator local_fe5;
  allocator local_fe4;
  allocator local_fe3;
  allocator local_fe2;
  allocator local_fe1;
  allocator local_fe0;
  allocator local_fdf;
  allocator local_fde;
  allocator local_fdd [20];
  allocator local_fc9;
  string *local_fc8;
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  CompilerHLSL *local_10;
  CompilerHLSL *this_local;
  
  local_10 = this;
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_1059 = 1;
      local_fc8 = local_fc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fc0,"AppendStructuredBuffer",&local_fc9);
      local_fc8 = local_fa0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fa0,"asm",local_fdd);
      local_fc8 = local_f80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f80,"asm_fragment",&local_fde);
      local_fc8 = local_f60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f60,"BlendState",&local_fdf);
      local_fc8 = local_f40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f40,"bool",&local_fe0);
      local_fc8 = local_f20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f20,"break",&local_fe1);
      local_fc8 = local_f00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f00,"Buffer",&local_fe2);
      local_fc8 = local_ee0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ee0,"ByteAddressBuffer",&local_fe3);
      local_fc8 = local_ec0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ec0,"case",&local_fe4);
      local_fc8 = local_ea0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ea0,"cbuffer",&local_fe5);
      local_fc8 = local_e80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e80,"centroid",&local_fe6);
      local_fc8 = local_e60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e60,"class",&local_fe7);
      local_fc8 = local_e40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e40,"column_major",&local_fe8);
      local_fc8 = local_e20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e20,"compile",&local_fe9);
      local_fc8 = local_e00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e00,"compile_fragment",&local_fea);
      local_fc8 = local_de0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_de0,"CompileShader",&local_feb);
      local_fc8 = local_dc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_dc0,"const",&local_fec);
      local_fc8 = local_da0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_da0,"continue",&local_fed);
      local_fc8 = local_d80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d80,"ComputeShader",&local_fee);
      local_fc8 = local_d60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d60,"ConsumeStructuredBuffer",&local_fef);
      local_fc8 = local_d40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d40,"default",&local_ff0);
      local_fc8 = local_d20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d20,"DepthStencilState",&local_ff1);
      local_fc8 = local_d00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d00,"DepthStencilView",&local_ff2);
      local_fc8 = local_ce0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ce0,"discard",&local_ff3);
      local_fc8 = local_cc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cc0,"do",&local_ff4);
      local_fc8 = local_ca0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ca0,"double",&local_ff5);
      local_fc8 = local_c80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c80,"DomainShader",&local_ff6);
      local_fc8 = local_c60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c60,"dword",&local_ff7);
      local_fc8 = local_c40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c40,"else",&local_ff8);
      local_fc8 = local_c20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c20,"export",&local_ff9);
      local_fc8 = local_c00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c00,"false",&local_ffa);
      local_fc8 = local_be0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_be0,"float",&local_ffb);
      local_fc8 = local_bc0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_bc0,"for",&local_ffc);
      local_fc8 = local_ba0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ba0,"fxgroup",&local_ffd);
      local_fc8 = local_b80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b80,"GeometryShader",&local_ffe);
      local_fc8 = local_b60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b60,"groupshared",&local_fff);
      local_fc8 = local_b40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b40,"half",&local_1000);
      local_fc8 = local_b20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b20,"HullShader",&local_1001);
      local_fc8 = local_b00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b00,"indices",&local_1002);
      local_fc8 = local_ae0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ae0,"if",&local_1003);
      local_fc8 = local_ac0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ac0,"in",&local_1004);
      local_fc8 = local_aa0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_aa0,"inline",&local_1005);
      local_fc8 = local_a80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a80,"inout",&local_1006);
      local_fc8 = local_a60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a60,"InputPatch",&local_1007);
      local_fc8 = local_a40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a40,"int",&local_1008);
      local_fc8 = local_a20;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a20,"interface",&local_1009);
      local_fc8 = local_a00;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a00,"line",&local_100a);
      local_fc8 = local_9e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9e0,"lineadj",&local_100b);
      local_fc8 = local_9c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9c0,"linear",&local_100c);
      local_fc8 = local_9a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9a0,"LineStream",&local_100d);
      local_fc8 = local_980;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_980,"matrix",&local_100e);
      local_fc8 = local_960;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_960,"min16float",&local_100f);
      local_fc8 = local_940;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_940,"min10float",&local_1010);
      local_fc8 = local_920;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_920,"min16int",&local_1011);
      local_fc8 = local_900;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_900,"min16uint",&local_1012);
      local_fc8 = local_8e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8e0,"namespace",&local_1013);
      local_fc8 = local_8c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8c0,"nointerpolation",&local_1014);
      local_fc8 = local_8a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8a0,"noperspective",&local_1015);
      local_fc8 = local_880;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_880,"NULL",&local_1016);
      local_fc8 = local_860;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_860,"out",&local_1017);
      local_fc8 = local_840;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_840,"OutputPatch",&local_1018);
      local_fc8 = local_820;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_820,"payload",&local_1019);
      local_fc8 = local_800;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_800,"packoffset",&local_101a);
      local_fc8 = local_7e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7e0,"pass",&local_101b);
      local_fc8 = local_7c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7c0,"pixelfragment",&local_101c);
      local_fc8 = local_7a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7a0,"PixelShader",&local_101d);
      local_fc8 = local_780;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_780,"point",&local_101e);
      local_fc8 = local_760;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_760,"PointStream",&local_101f);
      local_fc8 = local_740;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_740,"precise",&local_1020);
      local_fc8 = local_720;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_720,"RasterizerState",&local_1021);
      local_fc8 = local_700;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_700,"RenderTargetView",&local_1022);
      local_fc8 = local_6e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6e0,"return",&local_1023);
      local_fc8 = local_6c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6c0,"register",&local_1024);
      local_fc8 = local_6a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6a0,"row_major",&local_1025);
      local_fc8 = local_680;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_680,"RWBuffer",&local_1026);
      local_fc8 = local_660;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_660,"RWByteAddressBuffer",&local_1027);
      local_fc8 = local_640;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_640,"RWStructuredBuffer",&local_1028);
      local_fc8 = local_620;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_620,"RWTexture1D",&local_1029);
      local_fc8 = local_600;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_600,"RWTexture1DArray",&local_102a);
      local_fc8 = local_5e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5e0,"RWTexture2D",&local_102b);
      local_fc8 = local_5c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5c0,"RWTexture2DArray",&local_102c);
      local_fc8 = local_5a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5a0,"RWTexture3D",&local_102d);
      local_fc8 = local_580;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_580,"sample",&local_102e);
      local_fc8 = local_560;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_560,"sampler",&local_102f);
      local_fc8 = local_540;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_540,"SamplerState",&local_1030);
      local_fc8 = local_520;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_520,"SamplerComparisonState",&local_1031);
      local_fc8 = local_500;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_500,"shared",&local_1032);
      local_fc8 = local_4e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4e0,"snorm",&local_1033);
      local_fc8 = local_4c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4c0,"stateblock",&local_1034);
      local_fc8 = local_4a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4a0,"stateblock_state",&local_1035);
      local_fc8 = local_480;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_480,"static",&local_1036);
      local_fc8 = local_460;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_460,"string",&local_1037);
      local_fc8 = local_440;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_440,"struct",&local_1038);
      local_fc8 = local_420;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_420,"switch",&local_1039);
      local_fc8 = local_400;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_400,"StructuredBuffer",&local_103a);
      local_fc8 = local_3e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3e0,"tbuffer",&local_103b);
      local_fc8 = local_3c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3c0,"technique",&local_103c);
      local_fc8 = local_3a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3a0,"technique10",&local_103d);
      local_fc8 = local_380;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_380,"technique11",&local_103e);
      local_fc8 = local_360;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_360,"texture",&local_103f);
      local_fc8 = local_340;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_340,"Texture1D",&local_1040);
      local_fc8 = local_320;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_320,"Texture1DArray",&local_1041);
      local_fc8 = local_300;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_300,"Texture2D",&local_1042);
      local_fc8 = local_2e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e0,"Texture2DArray",&local_1043);
      local_fc8 = local_2c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2c0,"Texture2DMS",&local_1044);
      local_fc8 = local_2a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2a0,"Texture2DMSArray",&local_1045);
      local_fc8 = local_280;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_280,"Texture3D",&local_1046);
      local_fc8 = local_260;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_260,"TextureCube",&local_1047);
      local_fc8 = local_240;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_240,"TextureCubeArray",&local_1048);
      local_fc8 = local_220;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_220,"true",&local_1049);
      local_fc8 = local_200;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_200,"typedef",&local_104a);
      local_fc8 = local_1e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1e0,"triangle",&local_104b);
      local_fc8 = local_1c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1c0,"triangleadj",&local_104c);
      local_fc8 = local_1a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a0,"TriangleStream",&local_104d);
      local_fc8 = local_180;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_180,"uint",&local_104e);
      local_fc8 = local_160;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_160,"uniform",&local_104f);
      local_fc8 = local_140;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_140,"unorm",&local_1050);
      local_fc8 = local_120;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_120,"unsigned",&local_1051);
      local_fc8 = local_100;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_100,"vector",&local_1052);
      local_fc8 = local_e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e0,"vertexfragment",&local_1053);
      local_fc8 = local_c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c0,"VertexShader",&local_1054);
      local_fc8 = local_a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0,"vertices",&local_1055);
      local_fc8 = local_80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_80,"void",&local_1056);
      local_fc8 = local_60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_60,"volatile",&local_1057);
      local_fc8 = local_40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"while",&local_1058);
      local_1059 = 0;
      local_20 = (iterator)local_fc0;
      local_18 = 0x7d;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_105c);
      __l._M_len = local_18;
      __l._M_array = local_20;
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&replace_illegal_names()::keywords_abi_cxx11_,__l,0,&local_105a,&local_105b,
                      &local_105c);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_105c);
      local_1848 = (string *)&local_20;
      do {
        local_1848 = local_1848 + -0x20;
        ::std::__cxx11::string::~string(local_1848);
      } while (local_1848 != local_fc0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1058);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1057);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1056);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1055);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1054);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1053);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1052);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1051);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1050);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_104f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_104e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_104d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_104c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_104b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_104a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1049);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1048);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1047);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1046);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1045);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1044);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1043);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1042);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1041);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1040);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_103f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_103e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_103d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_103c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_103b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_103a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1039);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1038);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1037);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1036);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1035);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1034);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1033);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1032);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1031);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1030);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_102f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_102e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_102d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_102c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_102b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_102a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1029);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1028);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1027);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1026);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1025);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1024);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1023);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1022);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1021);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1020);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1019);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1018);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1017);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1016);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1015);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1014);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1013);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1012);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1011);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1010);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1009);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1008);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1007);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1006);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1005);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1004);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1003);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1002);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1001);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1000);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fff);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffe);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fef);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fee);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fed);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fec);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_feb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fea);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fdf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fde);
      ::std::allocator<char>::~allocator((allocator<char> *)local_fdd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  CompilerGLSL::replace_illegal_names
            (&this->super_CompilerGLSL,&replace_illegal_names()::keywords_abi_cxx11_);
  CompilerGLSL::replace_illegal_names(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerHLSL::replace_illegal_names()
{
	static const unordered_set<string> keywords = {
		// Additional HLSL specific keywords.
		// From https://docs.microsoft.com/en-US/windows/win32/direct3dhlsl/dx-graphics-hlsl-appendix-keywords
		"AppendStructuredBuffer", "asm", "asm_fragment",
		"BlendState", "bool", "break", "Buffer", "ByteAddressBuffer",
		"case", "cbuffer", "centroid", "class", "column_major", "compile",
		"compile_fragment", "CompileShader", "const", "continue", "ComputeShader",
		"ConsumeStructuredBuffer",
		"default", "DepthStencilState", "DepthStencilView", "discard", "do",
		"double", "DomainShader", "dword",
		"else", "export", "false", "float", "for", "fxgroup",
		"GeometryShader", "groupshared", "half", "HullShader",
		"indices", "if", "in", "inline", "inout", "InputPatch", "int", "interface",
		"line", "lineadj", "linear", "LineStream",
		"matrix", "min16float", "min10float", "min16int", "min16uint",
		"namespace", "nointerpolation", "noperspective", "NULL",
		"out", "OutputPatch",
		"payload", "packoffset", "pass", "pixelfragment", "PixelShader", "point",
		"PointStream", "precise", "RasterizerState", "RenderTargetView",
		"return", "register", "row_major", "RWBuffer", "RWByteAddressBuffer",
		"RWStructuredBuffer", "RWTexture1D", "RWTexture1DArray", "RWTexture2D",
		"RWTexture2DArray", "RWTexture3D", "sample", "sampler", "SamplerState",
		"SamplerComparisonState", "shared", "snorm", "stateblock", "stateblock_state",
		"static", "string", "struct", "switch", "StructuredBuffer", "tbuffer",
		"technique", "technique10", "technique11", "texture", "Texture1D",
		"Texture1DArray", "Texture2D", "Texture2DArray", "Texture2DMS", "Texture2DMSArray",
		"Texture3D", "TextureCube", "TextureCubeArray", "true", "typedef", "triangle",
		"triangleadj", "TriangleStream", "uint", "uniform", "unorm", "unsigned",
		"vector", "vertexfragment", "VertexShader", "vertices", "void", "volatile", "while",
	};

	CompilerGLSL::replace_illegal_names(keywords);
	CompilerGLSL::replace_illegal_names();
}